

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O3

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
winmd::reader::CustomAttribute::TypeNamespaceAndName
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,CustomAttribute *this)

{
  table_base *this_00;
  database *this_01;
  uint uVar1;
  uint uVar2;
  database *pdVar3;
  uint32_t row;
  table<winmd::reader::TypeDef> *ptVar4;
  database *pdVar5;
  table<winmd::reader::MemberRef> *this_02;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  TypeDef TVar7;
  string_view sVar8;
  string local_50;
  
  uVar1 = table_base::get_value<unsigned_int>
                    ((this->super_row_base<winmd::reader::CustomAttribute>).m_table,
                     (this->super_row_base<winmd::reader::CustomAttribute>).m_index,1);
  this_00 = (this->super_row_base<winmd::reader::CustomAttribute>).m_table;
  uVar2 = table_base::get_value<unsigned_int>
                    (this_00,(this->super_row_base<winmd::reader::CustomAttribute>).m_index,1);
  pdVar3 = this_00->m_database;
  if ((uVar1 & 7) == 3) {
    this_02 = &pdVar3->MemberRef;
    uVar1 = table_base::get_value<unsigned_int>(&this_02->super_table_base,(uVar2 >> 3) - 1,0);
    if ((uVar1 & 7) != 1) {
      if ((uVar1 & 7) != 0) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "A CustomAttribute MemberRef should only be a TypeDef or TypeRef","");
        impl::throw_invalid(&local_50);
      }
      pdVar5 = (this_02->super_table_base).m_database;
      pdVar3 = (database *)&pdVar5->TypeDef;
      row = (uVar1 >> 3) - 1;
      this_01 = (pdVar5->TypeDef).super_table_base.m_database;
      uVar1 = table_base::get_value<unsigned_int>((table_base *)pdVar3,row,2);
      bVar6 = database::get_string(this_01,uVar1);
      pdVar5 = (pdVar5->TypeDef).super_table_base.m_database;
      goto LAB_0014ae32;
    }
    pdVar3 = (this_02->super_table_base).m_database;
    uVar1 = uVar1 >> 3;
    pdVar5 = (pdVar3->TypeRef).super_table_base.m_database;
  }
  else {
    pdVar3 = (pdVar3->MethodDef).super_table_base.m_database;
    ptVar4 = &pdVar3->TypeDef;
    local_50._M_dataplus._M_p._0_4_ = uVar2 >> 3;
    TVar7 = std::
            __upper_bound<winmd::reader::TypeDef,unsigned_int,__gnu_cxx::__ops::_Val_comp_iter<winmd::reader::row_base<winmd::reader::MethodDef>::get_parent_row<winmd::reader::TypeDef,5u>()const::compare>>
                      (ptVar4,0,ptVar4,(pdVar3->TypeDef).super_table_base.m_row_count);
    pdVar3 = (database *)TVar7.super_row_base<winmd::reader::TypeDef>.m_table;
    uVar1 = TVar7.super_row_base<winmd::reader::TypeDef>.m_index;
    pdVar5 = (pdVar3->TypeRef).super_table_base.m_database;
  }
  row = uVar1 - 1;
  uVar1 = table_base::get_value<unsigned_int>((table_base *)pdVar3,row,2);
  bVar6 = database::get_string(pdVar5,uVar1);
  pdVar5 = (pdVar3->TypeRef).super_table_base.m_database;
LAB_0014ae32:
  uVar1 = table_base::get_value<unsigned_int>((table_base *)pdVar3,row,1);
  sVar8 = database::get_string(pdVar5,uVar1);
  __return_storage_ptr__->first = bVar6;
  (__return_storage_ptr__->second)._M_len = sVar8._M_len;
  (__return_storage_ptr__->second)._M_str = sVar8._M_str;
  return __return_storage_ptr__;
}

Assistant:

inline auto CustomAttribute::TypeNamespaceAndName() const
    {
        if (Type().type() == CustomAttributeType::MemberRef)
        {
            auto const& member_parent = Type().MemberRef().Class();
            switch (member_parent.type())
            {
            case MemberRefParent::TypeDef:
            {
                auto const& def = member_parent.TypeDef();
                return std::pair{ def.TypeNamespace(), def.TypeName() };
            }

            case MemberRefParent::TypeRef:
            {
                auto const& ref = member_parent.TypeRef();
                return std::pair{ ref.TypeNamespace(), ref.TypeName() };
            }
            default:
                impl::throw_invalid("A CustomAttribute MemberRef should only be a TypeDef or TypeRef");
            }
        }
        else
        {
            auto const& def = Type().MethodDef().Parent();
            return std::pair{ def.TypeNamespace(), def.TypeName() };
        }
    }